

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckFuncVar(Validator *this,Var *var,Func **out_func)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  const_reference ppFVar3;
  uint local_2c;
  Func **ppFStack_28;
  Index index;
  Func **out_func_local;
  Var *var_local;
  Validator *this_local;
  
  ppFStack_28 = out_func;
  out_func_local = (Func **)var;
  var_local = (Var *)this;
  sVar2 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size
                    (&this->current_module_->funcs);
  result = CheckVar(this,(Index)sVar2,(Var *)out_func_local,"function",&local_2c);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (ppFStack_28 != (Func **)0x0) {
      ppFVar3 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                          (&this->current_module_->funcs,(ulong)local_2c);
      *ppFStack_28 = *ppFVar3;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckFuncVar(const Var* var, const Func** out_func) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->funcs.size(), var, "function", &index));
  if (out_func) {
    *out_func = current_module_->funcs[index];
  }
  return Result::Ok;
}